

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O2

Result joypad_write(JoypadBuffer *buffer,FileData *file_data)

{
  JoypadBuffer *pJVar1;
  u8 *__dest;
  size_t __n;
  
  __dest = file_data->data;
  pJVar1 = buffer;
  while (pJVar1 = (JoypadBuffer *)(pJVar1->sentinel).next, pJVar1 != buffer) {
    __n = (pJVar1->sentinel).size * 0x10;
    memcpy(__dest,(pJVar1->sentinel).data,__n);
    __dest = __dest + __n;
  }
  return OK;
}

Assistant:

Result joypad_write(JoypadBuffer* buffer, FileData* file_data) {
  JoypadChunk* chunk = buffer->sentinel.next;
  u8* p = file_data->data;
  while (chunk != &buffer->sentinel) {
    size_t chunk_size = chunk->size * sizeof(JoypadState);
    memcpy(p, chunk->data, chunk_size);
    p += chunk_size;
    chunk = chunk->next;
  }
  return OK;
}